

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

void r_code::Utils::SetString(Atom *iptr,string *s)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  uint32_t a;
  byte characterCount;
  long lVar4;
  ulong uVar5;
  Atom local_3c;
  Atom local_38;
  Atom local_34;
  
  uVar1 = s->_M_string_length;
  characterCount = (byte)uVar1;
  Atom::String(&local_38,characterCount);
  Atom::operator=(iptr,&local_38);
  Atom::~Atom(&local_38);
  if (characterCount == 0) {
    a = 0;
    uVar5 = 1;
  }
  else {
    lVar4 = 0;
    bVar2 = 0;
    a = 0;
    bVar3 = 0;
    do {
      a = (int)(s->_M_dataplus)._M_p[lVar4] << (bVar2 & 0x1f) | a;
      bVar2 = bVar2 + 8;
      if (bVar2 == 0x40) {
        Atom::Atom(&local_34,a);
        bVar3 = bVar3 + 1;
        Atom::operator=(iptr + bVar3,&local_34);
        Atom::~Atom(&local_34);
        a = 0;
        bVar2 = 0;
      }
      lVar4 = lVar4 + 1;
    } while ((byte)lVar4 < characterCount);
    uVar5 = (ulong)(byte)(bVar3 + 1);
  }
  if ((uVar1 & 3) != 0) {
    Atom::Atom(&local_3c,a);
    Atom::operator=(iptr + uVar5,&local_3c);
    Atom::~Atom(&local_3c);
  }
  return;
}

Assistant:

void Utils::SetString(Atom *iptr, const std::string &s)
{
    uint8_t l = (uint8_t)s.length();
    uint8_t index = 0;
    iptr[index] = Atom::String(l);
    uint64_t _st = 0;
    int8_t shift = 0;

    for (uint8_t i = 0; i < l; ++i) {
        _st |= s[i] << shift;
        shift += 8;

        if (shift == 64) {
            iptr[++index] = _st;
            _st = 0;
            shift = 0;
        }
    }

    if (l % 4) {
        iptr[++index] = _st;
    }
}